

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

char  [7] kj::_::Debug::makeDescription<unsigned_long&>(char *macroArgs,unsigned_long *params)

{
  char *pcVar1;
  size_t sVar2;
  kj *in_RDX;
  size_t in_R8;
  ArrayPtr<kj::String> argValues_00;
  char argValues [1] [7];
  String local_38;
  
  str<unsigned_long&>(&local_38,in_RDX,(unsigned_long *)in_RDX);
  argValues_00.size_ = in_R8;
  argValues_00.ptr = (String *)0x1;
  makeDescriptionInternal((String *)macroArgs,(Debug *)params,(char *)&local_38,argValues_00);
  sVar2 = local_38.content.size_;
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return SUB87(macroArgs,0);
}

Assistant:

String Debug::makeDescription(const char* macroArgs, Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  return makeDescriptionInternal(macroArgs, arrayPtr(argValues, sizeof...(Params)));
}